

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O0

bool deqp::egl::notColorBits<8,8,8,0>(CandidateConfig *c)

{
  int iVar1;
  undefined1 local_11;
  CandidateConfig *c_local;
  
  iVar1 = eglu::CandidateConfig::redSize(c);
  local_11 = true;
  if (iVar1 == 8) {
    iVar1 = eglu::CandidateConfig::greenSize(c);
    local_11 = true;
    if (iVar1 == 8) {
      iVar1 = eglu::CandidateConfig::blueSize(c);
      local_11 = true;
      if (iVar1 == 8) {
        iVar1 = eglu::CandidateConfig::alphaSize(c);
        local_11 = iVar1 != 0;
      }
    }
  }
  return local_11;
}

Assistant:

static bool notColorBits (const eglu::CandidateConfig& c)
{
	return c.redSize()		!= Red		||
		   c.greenSize()	!= Green	||
		   c.blueSize()		!= Blue		||
		   c.alphaSize()	!= Alpha;
}